

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_reorder_fold.hpp
# Opt level: O2

ans_reorder_fold_encode<2U> *
ans_reorder_fold_encode<2U>::create
          (ans_reorder_fold_encode<2U> *__return_storage_ptr__,uint32_t *in_u32,size_t n)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  uint uVar1;
  pointer puVar2;
  ans_reorder_fold_encode<2U> *paVar3;
  uint32_t uVar4;
  size_t i;
  size_t sVar5;
  pointer ppVar6;
  pointer puVar7;
  int iVar8;
  size_t i_1;
  ulong uVar9;
  uint64_t uVar10;
  uint64_t *puVar11;
  uint uVar12;
  size_t i_3;
  uint32_t uVar13;
  long lVar14;
  ulong __n;
  allocator_type local_81;
  ans_reorder_fold_encode<2U> *local_80;
  vector<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
  unmapped_freqs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> freqs;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  uVar12 = 0;
  (__return_storage_ptr__->table).
  super__Vector_base<enc_entry_reorder_fold,_std::allocator<enc_entry_reorder_fold>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<enc_entry_reorder_fold,_std::allocator<enc_entry_reorder_fold>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->mapping).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->mapping).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->mapping).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->most_frequent).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->most_frequent).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->most_frequent).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<enc_entry_reorder_fold,_std::allocator<enc_entry_reorder_fold>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<enc_entry_reorder_fold,_std::allocator<enc_entry_reorder_fold>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<enc_entry_reorder_fold,_std::allocator<enc_entry_reorder_fold>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->mapping).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->mapping).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (sVar5 = 0; n != sVar5; sVar5 = sVar5 + 1) {
    if (uVar12 < in_u32[sVar5]) {
      uVar12 = in_u32[sVar5];
    }
  }
  __n = (ulong)(uVar12 + 1);
  local_80 = __return_storage_ptr__;
  std::vector<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>::
  vector(&unmapped_freqs,__n,(allocator_type *)&freqs);
  for (sVar5 = 0; n != sVar5; sVar5 = sVar5 + 1) {
    uVar1 = in_u32[sVar5];
    unmapped_freqs.
    super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar1].first =
         unmapped_freqs.
         super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar1].first + -1;
    unmapped_freqs.
    super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start[uVar1].second = uVar1;
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<std::pair<long,unsigned_int>*,std::vector<std::pair<long,unsigned_int>,std::allocator<std::pair<long,unsigned_int>>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (unmapped_freqs.
             super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             unmapped_freqs.
             super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  __return_storage_ptr__->sigma = 0;
  uVar10 = 1;
  for (ppVar6 = unmapped_freqs.
                super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      (uVar10 - ((long)unmapped_freqs.
                       super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)unmapped_freqs.
                       super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4) != 1 && (ppVar6->first != 0))
      ; ppVar6 = ppVar6 + 1) {
    __return_storage_ptr__->sigma = uVar10;
    uVar10 = uVar10 + 1;
  }
  this = &__return_storage_ptr__->mapping;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(this,__n);
  if (__return_storage_ptr__->sigma < 0x200) {
    puVar7 = (this->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar9 = 0; __n != uVar9; uVar9 = uVar9 + 1) {
      puVar7[uVar9] = (uint)uVar9;
    }
  }
  else {
    puVar7 = (this->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar14 = 0; (ulong)uVar12 + 1 != lVar14; lVar14 = lVar14 + 1) {
      puVar7[lVar14] = (int)lVar14 + 0x200;
    }
    uVar12 = 0;
    for (lVar14 = 8; lVar14 != 0x2008; lVar14 = lVar14 + 0x10) {
      (this->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start
      [*(uint *)((long)&(unmapped_freqs.
                         super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->first + lVar14)] = uVar12;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&__return_storage_ptr__->most_frequent,
                 (value_type *)
                 ((long)&(unmapped_freqs.
                          super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->first + lVar14));
      uVar12 = uVar12 + 1;
    }
  }
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&freqs,0x800,(value_type_conflict2 *)&local_48,&local_81);
  uVar13 = 0;
  for (sVar5 = 0; n != sVar5; sVar5 = sVar5 + 1) {
    uVar4 = ans_reorder_fold_mapping<2u>
                      ((this->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start[in_u32[sVar5]]);
    freqs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar4] =
         freqs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start[uVar4] + 1;
    if (uVar13 < uVar4) {
      uVar13 = uVar4;
    }
  }
  adjust_freqs((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&freqs,uVar13,true,1
              );
  paVar3 = local_80;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&local_80->nfreqs,&local_48);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  iVar8 = 0;
  for (puVar7 = (paVar3->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      puVar7 != (paVar3->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish; puVar7 = puVar7 + 1) {
    iVar8 = iVar8 + *puVar7;
  }
  paVar3->frame_size = (long)iVar8;
  std::vector<enc_entry_reorder_fold,_std::allocator<enc_entry_reorder_fold>_>::resize
            (&paVar3->table,(ulong)(uVar13 + 1));
  puVar7 = (paVar3->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (paVar3->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar13 = 0;
  puVar11 = &((paVar3->table).
              super__Vector_base<enc_entry_reorder_fold,_std::allocator<enc_entry_reorder_fold>_>.
              _M_impl.super__Vector_impl_data._M_start)->sym_upper_bound;
  for (lVar14 = 0; (long)puVar2 - (long)puVar7 >> 2 != lVar14; lVar14 = lVar14 + 1) {
    ((enc_entry_reorder_fold *)(puVar11 + -1))->freq = (uint16_t)puVar7[lVar14];
    *(uint32_t *)((long)puVar11 + -4) = uVar13;
    uVar13 = uVar13 + puVar7[lVar14];
    *puVar11 = (ulong)puVar7[lVar14] << 0x24;
    puVar11 = puVar11 + 2;
  }
  paVar3->lower_bound = paVar3->frame_size << 4;
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&freqs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
  ::~_Vector_base(&unmapped_freqs.
                   super__Vector_base<std::pair<long,_unsigned_int>,_std::allocator<std::pair<long,_unsigned_int>_>_>
                 );
  return paVar3;
}

Assistant:

static ans_reorder_fold_encode create(const uint32_t* in_u32, size_t n)
    {
        ans_reorder_fold_encode model;

        // 1) identify most frequent syms
        uint32_t unmapped_max_sym = 0;
        for (size_t i = 0; i < n; i++) {
            unmapped_max_sym = std::max(in_u32[i], unmapped_max_sym);
        }
        std::vector<std::pair<int64_t, uint32_t>> unmapped_freqs(
            unmapped_max_sym + 1);
        for (size_t i = 0; i < n; i++) {
            unmapped_freqs[in_u32[i]].first--;
            unmapped_freqs[in_u32[i]].second = in_u32[i];
        }
        std::sort(unmapped_freqs.begin(), unmapped_freqs.end());
        model.sigma = 0;
        for (size_t i = 0; i < unmapped_freqs.size(); i++) {
            if (unmapped_freqs[i].first == 0)
                break;
            model.sigma++;
        }
        size_t no_except_thres = 1 << (fidelity + 8 - 1);
        model.mapping.resize(unmapped_max_sym + 1);
        if (model.sigma < no_except_thres) {
            for (size_t i = 0; i < unmapped_max_sym + 1; i++) {
                model.mapping[i] = i;
            }
        } else {
            for (size_t i = 0; i <= unmapped_max_sym; i++) {
                model.mapping[i] = i + no_except_thres;
            }
            for (size_t i = 0; i < no_except_thres; i++) {
                model.mapping[unmapped_freqs[i].second] = i;
                model.most_frequent.push_back(unmapped_freqs[i].second);
            }
        }
        const uint32_t MAX_SIGMA = 1 << (fidelity + 8 + 1);
        std::vector<uint64_t> freqs(MAX_SIGMA, 0);
        uint32_t max_sym = 0;
        for (size_t i = 0; i < n; i++) {
            auto mapped_u32
                = ans_reorder_fold_mapping<fidelity>(model.mapping[in_u32[i]]);
            freqs[mapped_u32]++;
            max_sym = std::max(mapped_u32, max_sym);
        }
        model.nfreqs = adjust_freqs(freqs, max_sym, true);
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        uint64_t cur_base = 0;
        uint64_t tmp = constants::K * constants::RADIX;
        model.table.resize(max_sym + 1);
        for (size_t sym = 0; sym < model.nfreqs.size(); sym++) {
            model.table[sym].freq = model.nfreqs[sym];
            model.table[sym].base = cur_base;
            model.table[sym].sym_upper_bound = tmp * model.nfreqs[sym];
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }